

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_perform_command(connectdata *conn)

{
  void *pvVar1;
  undefined8 *puVar2;
  char *pcVar3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *address;
  hostname host;
  char *local_60;
  hostname local_58;
  
  pvVar1 = (conn->data->req).protop;
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x10);
  if (puVar2 == (undefined8 *)0x0) {
    pcVar3 = *(char **)((long)pvVar1 + 8);
    if (pcVar3 == (char *)0x0) {
      pcVar8 = "HELP";
    }
    else {
      pcVar8 = "HELP";
      if (*pcVar3 != '\0') {
        pcVar8 = pcVar3;
      }
    }
    CVar6 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",pcVar8);
  }
  else {
    pcVar3 = *(char **)((long)pvVar1 + 8);
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      local_60 = (char *)0x0;
      local_58.name = (char *)0x0;
      local_58.dispname = (char *)0x0;
      local_58.rawalloc = (char *)0x0;
      local_58.encalloc = (char *)0x0;
      CVar6 = smtp_parse_address(conn,(char *)*puVar2,&local_60,&local_58);
      pcVar3 = local_60;
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if ((conn->proto).imapc.resptag[2] == '\0') {
        pcVar8 = "";
      }
      else {
        pcVar8 = " SMTPUTF8";
        if ((local_58.encalloc == (char *)0x0) && (_Var4 = Curl_is_ASCII_name(local_60), _Var4)) {
          _Var4 = Curl_is_ASCII_name(local_58.name);
          pcVar8 = " SMTPUTF8";
          if (_Var4) {
            pcVar8 = "";
          }
        }
      }
      pcVar7 = "@";
      pcVar9 = local_58.name;
      if (local_58.name == (char *)0x0) {
        pcVar7 = "";
        pcVar9 = "";
      }
      CVar6 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"VRFY %s%s%s%s",pcVar3,pcVar7,pcVar9,pcVar8);
      Curl_free_idnconverted_hostname(&local_58);
      (*Curl_cfree)(pcVar3);
    }
    else {
      if ((conn->proto).imapc.resptag[2] == '\x01') {
        iVar5 = strcmp(pcVar3,"EXPN");
        pcVar8 = "";
        if (iVar5 == 0) {
          pcVar8 = " SMTPUTF8";
        }
      }
      else {
        pcVar8 = "";
      }
      CVar6 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s%s",pcVar3,*puVar2,pcVar8);
    }
  }
  if (CVar6 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_LIST;
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

static CURLcode smtp_perform_command(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  if(smtp->rcpt) {
    /* We notify the server we are sending UTF-8 data if a) it supports the
       SMTPUTF8 extension and b) The mailbox contains UTF-8 charaacters, in
       either the local address or host name parts. This is regardless of
       whether the host name is encoded using IDN ACE */
    bool utf8 = FALSE;

    if((!smtp->custom) || (!smtp->custom[0])) {
      char *address = NULL;
      struct hostname host = { NULL, NULL, NULL, NULL };

      /* Parse the mailbox to verify into the local address and host name
         parts, converting the host name to an IDN A-label if necessary */
      result = smtp_parse_address(conn, smtp->rcpt->data,
                                  &address, &host);
      if(result)
        return result;

      /* Establish whether we should report SMTPUTF8 to the server for this
         mailbox as per RFC-6531 sect. 3.1 point 6 */
      utf8 = (conn->proto.smtpc.utf8_supported) &&
             ((host.encalloc) || (!Curl_is_ASCII_name(address)) ||
              (!Curl_is_ASCII_name(host.name)));

      /* Send the VRFY command (Note: The host name part may be absent when the
         host is a local system) */
      result = Curl_pp_sendf(&conn->proto.smtpc.pp, "VRFY %s%s%s%s",
                             address,
                             host.name ? "@" : "",
                             host.name ? host.name : "",
                             utf8 ? " SMTPUTF8" : "");

      Curl_free_idnconverted_hostname(&host);
      free(address);
    }
    else {
      /* Establish whether we should report that we support SMTPUTF8 for EXPN
         commands to the server as per RFC-6531 sect. 3.1 point 6 */
      utf8 = (conn->proto.smtpc.utf8_supported) &&
             (!strcmp(smtp->custom, "EXPN"));

      /* Send the custom recipient based command such as the EXPN command */
      result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s %s%s", smtp->custom,
                             smtp->rcpt->data,
                             utf8 ? " SMTPUTF8" : "");
    }
  }
  else
    /* Send the non-recipient based command such as HELP */
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s",
                           smtp->custom && smtp->custom[0] != '\0' ?
                           smtp->custom : "HELP");

  if(!result)
    state(conn, SMTP_COMMAND);

  return result;
}